

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

LaneArray<2> * __thiscall
wasm::Literal::getLanesF64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  anon_union_16_5_9943fe1e_for_Literal_0 *this_00;
  long lVar1;
  anon_union_16_5_9943fe1e_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanesI64x2(__return_storage_ptr__,this);
  lVar1 = 0;
  do {
    if (*(long *)((long)&__return_storage_ptr__->_M_elems[0].type.id + lVar1) != 3) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x14f,"Literal wasm::Literal::castToF64()");
    }
    this_00 = (anon_union_16_5_9943fe1e_for_Literal_0 *)
              ((long)&__return_storage_ptr__->_M_elems[0].field_0 + lVar1);
    local_30 = 5;
    local_40.i64 = ((anon_union_16_5_9943fe1e_for_Literal_0 *)&(this_00->func).super_IString)->i64;
    if (this_00 != &local_40) {
      ~Literal((Literal *)&this_00->func);
      Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    ~Literal((Literal *)&local_40.func);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  return __return_storage_ptr__;
}

Assistant:

LaneArray<2> Literal::getLanesF64x2() const {
  auto lanes = getLanesI64x2();
  for (size_t i = 0; i < lanes.size(); ++i) {
    lanes[i] = lanes[i].castToF64();
  }
  return lanes;
}